

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListUpdateMutableCommandKernelsExpPrologue
          (ZEHandleLifetimeValidation *this,ze_command_list_handle_t hCommandList,
          uint32_t numKernels,uint64_t *pCommandId,ze_kernel_handle_t *phKernels)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  size_t i;
  ulong uVar4;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hCommandList);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    if (phKernels == (ze_kernel_handle_t *)0x0) {
LAB_001787dd:
      zVar3 = ZE_RESULT_SUCCESS;
    }
    else {
      uVar4 = 0;
      do {
        if (numKernels == uVar4) goto LAB_001787dd;
        bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phKernels[uVar4]);
        uVar4 = uVar4 + 1;
      } while (bVar2);
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListUpdateMutableCommandKernelsExpPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numKernels,                            ///< [in] the number of kernels to update
        uint64_t* pCommandId,                           ///< [in][range(0, numKernels)] command identifier
        ze_kernel_handle_t* phKernels                   ///< [in][range(0, numKernels)] handle of the kernel for a command
                                                        ///< identifier to switch to
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phKernels) && (i < numKernels); ++i){
            if (!context.handleLifetime->isHandleValid( phKernels[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }